

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

IndexPair __thiscall
slang::IntervalMap<int,int,0u>::
modifyRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>,slang::IntervalMapDetails::BranchNode<int,12u,false>,false>
          (IntervalMap<int,int,0u> *this,BranchNode<int,_12U,_true> *rootNode,uint32_t position,
          allocator_type *alloc)

{
  uint32_t uVar1;
  int iVar2;
  ulong uVar3;
  IndexPair IVar4;
  BranchNode<int,_12U,_false> *pBVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  uint32_t sizes [2];
  NodeRef nodes [2];
  uint32_t local_50 [2];
  ulong local_48 [3];
  
  IVar4 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),0x10,local_50,position);
  local_48[0] = 0;
  local_48[1] = 0;
  iVar7 = 0;
  lVar6 = 0;
  do {
    pBVar5 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    uVar1 = local_50[lVar6];
    if (uVar1 != 0) {
      lVar8 = 0;
      do {
        uVar10 = iVar7 + (int)lVar8;
        (pBVar5->
        super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
        ).first[lVar8].pip.value =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
             ).first[uVar10].pip.value;
        (pBVar5->
        super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
        ).second[lVar8] =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
             ).second[uVar10];
        lVar8 = lVar8 + 1;
      } while (uVar1 != (uint32_t)lVar8);
    }
    iVar7 = iVar7 + uVar1;
    local_48[lVar6] = (ulong)pBVar5 & 0xffffffffffffffc0 | (ulong)(uVar1 - 1);
    bVar11 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar11);
  lVar6 = 0;
  do {
    uVar3 = local_48[lVar6];
    uVar9 = uVar3 & 0xffffffffffffffc0;
    iVar7 = *(int *)(uVar9 + 100);
    if (1 < (ulong)local_50[lVar6]) {
      lVar8 = 0;
      do {
        iVar2 = *(int *)(uVar9 + 0x6c + lVar8 * 8);
        if (iVar7 <= iVar2) {
          iVar7 = iVar2;
        }
        lVar8 = lVar8 + 1;
      } while ((ulong)local_50[lVar6] - 1 != lVar8);
    }
    *(ulong *)(this + lVar6 * 8 + 0x60) = CONCAT44(iVar7,*(undefined4 *)(uVar9 + 0x60));
    *(ulong *)(this + lVar6 * 8) = uVar3;
    bVar11 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar11);
  *(undefined4 *)(this + 0xc4) = 2;
  *(int *)(this + 0xc0) = *(int *)(this + 0xc0) + 1;
  return IVar4;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}